

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O2

void __thiscall
kj::TlsPrivateKey::TlsPrivateKey(TlsPrivateKey *this,StringPtr pem,Maybe<kj::StringPtr> *password)

{
  EVP_PKEY *pEVar1;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:1011:3)>
  _kjDefer1011;
  BIO *bio;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:1011:3)>
  local_28;
  BIO *local_18;
  
  local_18 = BIO_new_mem_buf(pem.content.ptr,(int)pem.content.size_ + -1);
  local_28.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:1011:3)>_2
        )&local_18;
  local_28.maybeFunc.ptr.isSet = true;
  pEVar1 = PEM_read_bio_PrivateKey(local_18,(EVP_PKEY **)0x0,passwordCallback,password);
  this->pkey = pEVar1;
  if (pEVar1 != (EVP_PKEY *)0x0) {
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:1011:3)>
    ::~Deferred(&local_28);
    return;
  }
  anon_unknown_310::throwOpensslError();
}

Assistant:

TlsPrivateKey::TlsPrivateKey(kj::StringPtr pem, kj::Maybe<kj::StringPtr> password) {
  ensureOpenSslInitialized();

  // const_cast apparently needed for older versions of OpenSSL.
  BIO* bio = BIO_new_mem_buf(const_cast<char*>(pem.begin()), pem.size());
  KJ_DEFER(BIO_free(bio));

  pkey = PEM_read_bio_PrivateKey(bio, nullptr, &passwordCallback, &password);
  if (pkey == nullptr) {
    throwOpensslError();
  }
}